

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O1

void __thiscall Array_sub_ranges_by_range_Test::TestBody(Array_sub_ranges_by_range_Test *this)

{
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *actual;
  AssertHelperData *expected;
  AssertionResult gtest_ar_2;
  by_value array2;
  array_reference_type view1;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  internal local_70;
  undefined7 uStack_6f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelperData *pAStack_60;
  void *local_50;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_48;
  
  iVar2 = posix_memalign((void **)&local_70,8,0x50);
  lVar3 = 0;
  local_50 = (void *)0x0;
  if (iVar2 == 0) {
    local_50 = (void *)CONCAT71(uStack_6f,local_70);
  }
  do {
    *(double *)((long)local_50 + lVar3 * 8) = (double)(int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  expected = (AssertHelperData *)((long)local_50 + 0x28);
  local_48.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .size_ = (size_type)&DAT_00000005;
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  local_90.data_._0_4_ = 5;
  local_48.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .pointer_ = (pointer)expected;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (&local_70,"view1.size()","5",(unsigned_long *)&local_88,(int *)&local_90);
  if (local_70 == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ =
       (AssertHelperData *)
       local_48.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)expected;
  testing::internal::CmpHelperEQ<double*,double*>
            (&local_70,"array1.data()+5","view1.data()",(double **)&local_88,(double **)&local_90);
  if (local_70 == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)((long)*(double *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
              *)&local_70,&local_48);
  local_90.data_ =
       (AssertHelperData *)
       local_48.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_78.data_ = (AssertHelperData *)local_68.ptr_;
  testing::internal::CmpHelperNE<double*,double*>
            ((internal *)&local_88,"view1.data()","array2.data()",(double **)&local_90,
             (double **)&local_78);
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)((long)*(double *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ =
       (AssertHelperData *)
       local_48.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .size_;
  local_78.data_ = pAStack_60;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"view1.size()","array2.size()",(unsigned_long *)&local_90,
             (unsigned_long *)&local_78);
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (pAStack_60 != (AssertHelperData *)&DAT_00000005) {
    actual = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_68.ptr_[1]._M_string_length;
    do {
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_88,"*it1","*it2",(double *)expected,
                 (double *)&actual->_M_allocated_capacity);
      if (local_88.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        pcVar4 = "";
        if (local_80.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((local_80.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
                   ,0x8d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_90.data_ + 8))();
          }
          local_90.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      actual = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)actual + 8);
      expected = (AssertHelperData *)&expected->file;
    } while (actual != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(&(local_68.ptr_)->_M_dataplus + (long)pAStack_60));
  }
  if (local_68.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    free(local_68.ptr_);
  }
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pAStack_60 = (AssertHelperData *)0x0;
  if (local_50 != (void *)0x0) {
    free(local_50);
  }
  return;
}

Assistant:

TEST(Array, sub_ranges_by_range) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // check that a view of a subrange works
    by_value array1(10);
    for(int i=0; i<10; i++)
        array1[i] = double(i);

    Range range1(5,10);
    auto view1 = array1(range1);
    EXPECT_EQ(view1.size(), 5);
    EXPECT_EQ(array1.data()+5, view1.data());

    // create a copy of the data in a view
    // should contain a copy of the second half of array1
    by_value array2(view1);
    EXPECT_NE(view1.data(), array2.data());
    EXPECT_EQ(view1.size(), array2.size());
    auto it1 = array1.data()+5;
    auto it2 = array2.data()+5;
    while(it2!=array2.data()+array2.size()) {
        EXPECT_EQ(*it1, *it2);
        ++it2;
        ++it1;
    }
}